

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

string * __thiscall
kratos::ConditionalExpr::to_string_abi_cxx11_(string *__return_storage_ptr__,ConditionalExpr *this)

{
  VarType VVar1;
  char (*format_str) [6];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  string_view format_str_00;
  string_view format_str_01;
  remove_reference_t<std::__cxx11::basic_string<char>_> local_1d0;
  remove_reference_t<std::__cxx11::basic_string<char>_&> local_1b0;
  byte local_179;
  v7 local_178 [32];
  undefined1 local_158 [8];
  string cond_str;
  ConditionalExpr *this_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_128;
  basic_string_view<char> local_118;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_108;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_f8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_e8;
  undefined1 *local_e0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_d8;
  basic_string_view<char> local_c8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  remove_reference_t<std::__cxx11::basic_string<char>_&> *local_78;
  char (*local_70) [15];
  char *local_68;
  string *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  cond_str.field_2._8_8_ = this;
  VVar1 = Var::type(this->condition);
  local_179 = 0;
  if (VVar1 == Expression) {
    (*(this->condition->super_IRNode)._vptr_IRNode[0x1f])();
    local_179 = 1;
    local_e0 = local_158;
    local_e8 = "({0})";
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_178;
    local_108.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string,char[6],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x42bf5e,local_178,format_str,
                    (remove_reference_t<std::__cxx11::basic_string<char>_> *)0x42bf5e);
    local_f8 = &local_108;
    local_118 = fmt::v7::to_string_view<char,_0>(local_e8);
    local_28 = &local_128;
    local_30 = local_f8;
    local_20 = local_f8;
    local_10 = local_f8;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_f8->string);
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_128.field_1.values_;
    format_str_00.size_ = local_128.desc_;
    format_str_00.data_ = (char *)local_118.size_;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_158,(detail *)local_118.data_,format_str_00,args);
  }
  else {
    (*(this->condition->super_IRNode)._vptr_IRNode[0x1f])(local_158);
  }
  if ((local_179 & 1) != 0) {
    std::__cxx11::string::~string((string *)local_178);
  }
  (*(((this->super_Expr).left)->super_IRNode)._vptr_IRNode[0x1f])(&local_1b0);
  (*(((this->super_Expr).right)->super_IRNode)._vptr_IRNode[0x1f])(&local_1d0);
  local_68 = "{0} ? {1}: {2}";
  local_70 = (char (*) [15])local_158;
  local_78 = &local_1b0;
  vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_1d0;
  local_60 = __return_storage_ptr__;
  fmt::v7::
  make_args_checked<std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string,char[15],char>
            (&local_b8,(v7 *)"{0} ? {1}: {2}",local_70,local_78,
             (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs_1,
             (remove_reference_t<std::__cxx11::basic_string<char>_> *)in_R9.values_);
  local_88 = &local_b8;
  local_c8 = fmt::v7::to_string_view<char,_0>(local_68);
  local_50 = &local_d8;
  local_58 = local_88;
  local_48 = local_88;
  local_38 = local_88;
  local_40 = local_50;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_50,0xddd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_88);
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_d8.field_1.values_;
  format_str_01.size_ = local_d8.desc_;
  format_str_01.data_ = (char *)local_c8.size_;
  fmt::v7::detail::vformat_abi_cxx11_
            (__return_storage_ptr__,(detail *)local_c8.data_,format_str_01,args_00);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)local_158);
  return __return_storage_ptr__;
}

Assistant:

std::string ConditionalExpr::to_string() const {
    std::string cond_str = condition->type() == VarType::Expression
                               ? ::format("({0})", condition->to_string())
                               : condition->to_string();
    return ::format("{0} ? {1}: {2}", cond_str, left->to_string(), right->to_string());
}